

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

void spvc_msl_sampler_ycbcr_conversion_init(spvc_msl_sampler_ycbcr_conversion *conv)

{
  conv->swizzle[2] = SPVC_MSL_COMPONENT_SWIZZLE_IDENTITY;
  conv->swizzle[3] = SPVC_MSL_COMPONENT_SWIZZLE_IDENTITY;
  conv->ycbcr_model = SPVC_MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY;
  conv->ycbcr_range = SPVC_MSL_SAMPLER_YCBCR_RANGE_ITU_FULL;
  conv->y_chroma_offset = SPVC_MSL_CHROMA_LOCATION_COSITED_EVEN;
  conv->swizzle[0] = SPVC_MSL_COMPONENT_SWIZZLE_IDENTITY;
  conv->swizzle[1] = SPVC_MSL_COMPONENT_SWIZZLE_IDENTITY;
  conv->swizzle[2] = SPVC_MSL_COMPONENT_SWIZZLE_IDENTITY;
  conv->planes = 0;
  conv->resolution = SPVC_MSL_FORMAT_RESOLUTION_444;
  conv->chroma_filter = SPVC_MSL_SAMPLER_FILTER_NEAREST;
  conv->x_chroma_offset = SPVC_MSL_CHROMA_LOCATION_COSITED_EVEN;
  return;
}

Assistant:

void spvc_msl_sampler_ycbcr_conversion_init(spvc_msl_sampler_ycbcr_conversion *conv)
{
#if SPIRV_CROSS_C_API_MSL
	MSLConstexprSampler defaults;
	conv->planes = defaults.planes;
	conv->resolution = static_cast<spvc_msl_format_resolution>(defaults.resolution);
	conv->chroma_filter = static_cast<spvc_msl_sampler_filter>(defaults.chroma_filter);
	conv->x_chroma_offset = static_cast<spvc_msl_chroma_location>(defaults.x_chroma_offset);
	conv->y_chroma_offset = static_cast<spvc_msl_chroma_location>(defaults.y_chroma_offset);
	for (int i = 0; i < 4; i++)
		conv->swizzle[i] = static_cast<spvc_msl_component_swizzle>(defaults.swizzle[i]);
	conv->ycbcr_model = static_cast<spvc_msl_sampler_ycbcr_model_conversion>(defaults.ycbcr_model);
	conv->ycbcr_range = static_cast<spvc_msl_sampler_ycbcr_range>(defaults.ycbcr_range);
#else
	memset(conv, 0, sizeof(*conv));
#endif
}